

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::rehash(raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *this,size_t n)

{
  long *plVar1;
  long *plVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  Layout LVar7;
  
  if (n != 0 || this->capacity_ != 0) {
    uVar3 = this->size_;
    if (n == 0 && uVar3 == 0) {
      sVar4 = this->capacity_;
      if (sVar4 != 0) {
        lVar6 = 0x10;
        sVar5 = 0;
        do {
          if (-1 < this->ctrl_[sVar5]) {
            plVar1 = *(long **)((long)this->slots_ + lVar6 + -0x10);
            plVar2 = (long *)((long)this->slots_ + lVar6);
            if (plVar2 != plVar1) {
              operator_delete(plVar1,*plVar2 + 1);
            }
          }
          sVar5 = sVar5 + 1;
          lVar6 = lVar6 + 0x28;
        } while (sVar4 != sVar5);
        LVar7 = MakeLayout(this->capacity_);
        Deallocate<8ul,phmap::priv::Alloc<std::pair<std::__cxx11::string_const,int>>>
                  ((Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                    *)&this->settings_,this->ctrl_,
                   (LVar7.
                    super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::__cxx11::basic_string<char>,_int>_>
                    .size_[0] + 7 & 0xfffffffffffffff8) +
                   LVar7.
                   super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::__cxx11::basic_string<char>,_int>_>
                   .size_[1] * 0x28);
        (this->settings_).
        super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
        this->ctrl_ = (ctrl_t *)0x0;
        this->slots_ = (slot_type *)0x0;
        this->size_ = 0;
        this->capacity_ = 0;
      }
      return;
    }
    if (uVar3 <= n) {
      uVar3 = n;
    }
    lVar6 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    sVar4 = 1;
    if (uVar3 != 0) {
      sVar4 = 0xffffffffffffffff >> (~(byte)lVar6 & 0x3f);
    }
    if ((n == 0) || (this->capacity_ < sVar4)) {
      resize(this,sVar4);
      return;
    }
  }
  return;
}

Assistant:

void rehash(size_t n) {
        if (n == 0 && capacity_ == 0) return;
        if (n == 0 && size_ == 0) {
            destroy_slots();
            infoz_.RecordStorageChanged(0, 0);
            return;
        }
        // bitor is a faster way of doing `max` here. We will round up to the next
        // power-of-2-minus-1, so bitor is good enough.
        auto m = NormalizeCapacity((std::max)(n, size()));
        // n == 0 unconditionally rehashes as per the standard.
        if (n == 0 || m > capacity_) {
            resize(m);
        }
    }